

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture3DProjOffsetBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  Texture3D *pTVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar1 = c->in[0].m_data[3];
  pTVar2 = c->textures[0].tex3D;
  tcu::sampleLevelArray3DOffset
            ((ConstPixelBufferAccess *)&local_28,(int)(pTVar2->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar2->m_view).m_numLevels,c->in[0].m_data[0] / fVar1,
             c->in[0].m_data[1] / fVar1,c->in[0].m_data[2] / fVar1,p->lod + c->in[1].m_data[0],
             (IVec3 *)c->textures);
  fVar1 = (p->scale).m_data[1];
  fVar3 = (p->scale).m_data[2];
  fVar4 = (p->scale).m_data[3];
  fVar5 = (p->bias).m_data[1];
  fVar6 = (p->bias).m_data[2];
  fVar7 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * local_28 + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * fStack_24 + fVar5;
  (c->color).m_data[2] = fVar3 * fStack_20 + fVar6;
  (c->color).m_data[3] = fVar4 * fStack_1c + fVar7;
  return;
}

Assistant:

static void		evalTexture3DProjOffsetBias		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3DOffset(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[0].z()/c.in[0].w(), p.lod+c.in[1].x(), p.offset)*p.scale + p.bias; }